

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenStructGet(BinaryenModuleRef module,BinaryenIndex index,BinaryenExpressionRef ref,
                 BinaryenType type,bool signed_)

{
  BinaryenType ref_00;
  Index index_00;
  StructGet *pSVar1;
  Type local_40;
  Builder local_38;
  byte local_29;
  BinaryenType BStack_28;
  bool signed__local;
  BinaryenType type_local;
  BinaryenExpressionRef ref_local;
  BinaryenModuleRef pMStack_10;
  BinaryenIndex index_local;
  BinaryenModuleRef module_local;
  
  local_29 = signed_;
  BStack_28 = type;
  type_local = (BinaryenType)ref;
  ref_local._4_4_ = index;
  pMStack_10 = module;
  wasm::Builder::Builder(&local_38,module);
  index_00 = ref_local._4_4_;
  ref_00 = type_local;
  wasm::Type::Type(&local_40,BStack_28);
  pSVar1 = wasm::Builder::makeStructGet
                     (&local_38,index_00,(Expression *)ref_00,Unordered,local_40,
                      (bool)(local_29 & 1));
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenStructGet(BinaryenModuleRef module,
                                        BinaryenIndex index,
                                        BinaryenExpressionRef ref,
                                        BinaryenType type,
                                        bool signed_) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStructGet(
        index, (Expression*)ref, MemoryOrder::Unordered, Type(type), signed_));
}